

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void pbrt::anon_class_1_0_00000001::__invoke(StatsAccumulator *accum)

{
  long in_FS_OFFSET;
  
  StatsAccumulator::ReportRatio
            (accum,"BVH/Primitives per leaf node",*(int64_t *)(in_FS_OFFSET + -0x2e0),
             *(int64_t *)(in_FS_OFFSET + -0x2d8));
  *(undefined8 *)(in_FS_OFFSET + -0x2e0) = 0;
  *(undefined8 *)(in_FS_OFFSET + -0x2d8) = 0;
  return;
}

Assistant:

static char decodeEscaped(int ch, const FileLoc &loc) {
    switch (ch) {
    case EOF:
        ErrorExit(&loc, "premature EOF after character escape '\\'");
    case 'b':
        return '\b';
    case 'f':
        return '\f';
    case 'n':
        return '\n';
    case 'r':
        return '\r';
    case 't':
        return '\t';
    case '\\':
        return '\\';
    case '\'':
        return '\'';
    case '\"':
        return '\"';
    default:
        ErrorExit(&loc, "unexpected escaped character \"%c\"", ch);
    }
    return 0;  // NOTREACHED
}